

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O2

void absl::lts_20250127::cord_internal::anon_unknown_0::
     AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
               (CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> rep,
               RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
               *raw_usage)

{
  bool bVar1;
  byte bVar2;
  CordRepSubstring *pCVar3;
  CordRepFlat *this;
  size_t sVar4;
  
  bVar1 = IsDataEdge(rep.rep);
  if (bVar1) {
    bVar2 = (rep.rep)->tag;
    if (bVar2 == 1) {
      raw_usage->total = raw_usage->total + 0x20;
      pCVar3 = CordRep::substring(rep.rep);
      rep.rep = pCVar3->child;
      bVar2 = (rep.rep)->tag;
    }
    if (bVar2 < 6) {
      sVar4 = (rep.rep)->length + 0x28;
    }
    else {
      this = CordRep::flat(rep.rep);
      sVar4 = CordRepFlat::AllocatedSize(this);
    }
    raw_usage->total = raw_usage->total + sVar4;
    return;
  }
  __assert_fail("IsDataEdge(rep.rep)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord_analysis.cc"
                ,0x78,
                "void absl::cord_internal::(anonymous namespace)::AnalyzeDataEdge(CordRepRef<mode>, RawUsage<mode> &) [mode = absl::cord_internal::(anonymous namespace)::Mode::kTotal]"
               );
}

Assistant:

void AnalyzeDataEdge(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  assert(IsDataEdge(rep.rep));

  // Consume all substrings
  if (rep.rep->tag == SUBSTRING) {
    raw_usage.Add(sizeof(CordRepSubstring), rep);
    rep = rep.Child(rep.rep->substring()->child);
  }

  // Consume FLAT / EXTERNAL
  const size_t size =
      rep.rep->tag >= FLAT
          ? rep.rep->flat()->AllocatedSize()
          : rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
  raw_usage.Add(size, rep);
}